

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O2

Sets * __thiscall wasm::LocalGraph::getSets(LocalGraph *this,LocalGet *get)

{
  int iVar1;
  const_iterator cVar2;
  Sets *pSVar3;
  LocalGet *local_18;
  LocalGet *get_local;
  
  local_18 = get;
  cVar2 = std::
          _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->getSetsMap)._M_h,&local_18);
  if (cVar2.
      super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pSVar3 = &getSets::empty;
    if (getSets(wasm::LocalGet*)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&getSets(wasm::LocalGet*)::empty);
      if (iVar1 != 0) {
        pSVar3 = &getSets::empty;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used = 0;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &getSets::empty.
              super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              .flexible._M_t._M_impl.super__Rb_tree_header._M_header;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &getSets::empty.
              super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              .flexible._M_t._M_impl.super__Rb_tree_header._M_header;
        getSets::empty.
        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     ::~SmallSetBase,&getSets::empty,&__dso_handle);
        __cxa_guard_release(&getSets(wasm::LocalGet*)::empty);
      }
    }
  }
  else {
    pSVar3 = (Sets *)((long)cVar2.
                            super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_false>
                            ._M_cur + 0x10);
  }
  return pSVar3;
}

Assistant:

const Sets& getSets(LocalGet* get) const {
    auto iter = getSetsMap.find(get);
    if (iter == getSetsMap.end()) {
      // A missing entry means there is nothing there (and we saved a little
      // space by not putting something there).
      //
      // Use a canonical constant empty set to avoid allocation.
      static const Sets empty;
      return empty;
    }
    return iter->second;
  }